

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_barrieruv(global_State *g,TValue *tv)

{
  TValue *tv_local;
  global_State *g_local;
  
  if (((g->gc).state == '\x01') || ((g->gc).state == '\x02')) {
    gc_mark(g,(GCobj *)(tv->u64 & 0x7fffffffffff));
  }
  else {
    *(byte *)(tv + -1) = *(byte *)(tv + -1) & 0xf8 | (g->gc).currentwhite & 3;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_gc_barrieruv(global_State *g, TValue *tv)
{
#define TV2MARKED(x) \
  (*((uint8_t *)(x) - offsetof(GCupval, tv) + offsetof(GCupval, marked)))
  if (g->gc.state == GCSpropagate || g->gc.state == GCSatomic)
    gc_mark(g, gcV(tv));
  else
    TV2MARKED(tv) = (TV2MARKED(tv) & (uint8_t)~LJ_GC_COLORS) | curwhite(g);
#undef TV2MARKED
}